

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O0

void __thiscall ProjectWriter::writeQuality(ProjectWriter *this)

{
  double dVar1;
  Node *pNVar2;
  bool bVar3;
  _Setw _Var4;
  _Setprecision _Var5;
  vector<Node_*,_std::allocator<Node_*>_> *this_00;
  reference ppNVar6;
  ostream *poVar7;
  double dVar8;
  Node *node;
  iterator __end1;
  iterator __begin1;
  vector<Node_*,_std::allocator<Node_*>_> *__range1;
  ProjectWriter *this_local;
  
  std::operator<<((ostream *)&this->field_0x18,"\n[QUALITY]\n");
  this_00 = &this->network->nodes;
  __end1 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(this_00);
  node = (Node *)std::vector<Node_*,_std::allocator<Node_*>_>::end(this_00);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                *)&node);
    if (!bVar3) break;
    ppNVar6 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&__end1);
    pNVar2 = *ppNVar6;
    if (0.0 < pNVar2->initQual) {
      poVar7 = (ostream *)std::ostream::operator<<(&this->field_0x18,std::left);
      _Var4 = std::setw(0x10);
      poVar7 = std::operator<<(poVar7,_Var4);
      poVar7 = std::operator<<(poVar7,(string *)&(pNVar2->super_Element).name);
      std::operator<<(poVar7," ");
      _Var4 = std::setw(0xc);
      poVar7 = std::operator<<((ostream *)&this->field_0x18,_Var4);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::fixed);
      _Var5 = std::setprecision(4);
      std::operator<<(poVar7,_Var5);
      dVar1 = pNVar2->initQual;
      dVar8 = Network::ucf(this->network,CONCEN);
      poVar7 = (ostream *)std::ostream::operator<<(&this->field_0x18,dVar1 * dVar8);
      std::operator<<(poVar7,"\n");
    }
    __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void ProjectWriter::writeQuality()
{
    fout << "\n[QUALITY]\n";
    for (Node* node : network->nodes)
    {
        if (node->initQual > 0.0)
        {
            fout << left << setw(16) << node->name << " ";
            fout << setw(12) << fixed << setprecision(4);
            fout << node->initQual * network->ucf(Units::CONCEN) << "\n";
        }
    }
}